

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_0::GroupClassInfo::advanceBrand(GroupClassInfo *this)

{
  optional<wasm::(anonymous_namespace)::BrandTypeIterator> *this_00;
  pointer pvVar1;
  pointer pvVar2;
  pointer puVar3;
  bool bVar4;
  ulong uVar5;
  uint *edge;
  pointer puVar6;
  initializer_list<wasm::HeapType> __l;
  initializer_list<wasm::HeapType> __l_00;
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l_01;
  HeapType local_80;
  RecGroupShape local_78;
  _Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_70;
  _Storage<wasm::HeapType,_true> local_58;
  RecGroupShape local_50;
  _Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_48;
  allocator_type local_22;
  allocator_type local_21;
  
  this_00 = &this->brand;
  if ((this->brand).
      super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>._M_payload.
      super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>.
      super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>._M_engaged ==
      true) {
    BrandTypeIterator::operator++((BrandTypeIterator *)this_00);
  }
  else {
    std::_Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>::_M_reset
              ((_Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator> *)this_00);
    *(pointer *)
     ((long)&(this->brand).
             super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>.
             _M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>
             .super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>.
             _M_payload._M_value.fields + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(this->brand).
             super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>.
             _M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>
             .super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>.
             _M_payload._M_value.fields + 0x10) = (pointer)0x0;
    *(undefined8 *)
     &(this_00->super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>).
      _M_payload.
      super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>.
      super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>._M_payload = 0;
    *(undefined8 *)
     &(this->brand).
      super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>._M_payload.
      super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>.
      super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>._M_payload.
      _M_value.fields.
      super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
         = 0;
    (this->brand).super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>.
    super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>._M_engaged = true;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_48;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::insert(&this->subtypeGraph,
             (this->subtypeGraph).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,__l_01);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    pvVar1 = (this->subtypeGraph).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->subtypeGraph).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (uVar5 = 1; uVar5 < (ulong)(((long)pvVar2 - (long)pvVar1) / 0x18);
        uVar5 = (ulong)((int)uVar5 + 1)) {
      puVar3 = *(pointer *)
                ((long)&pvVar1[uVar5].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (puVar6 = pvVar1[uVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start; puVar6 != puVar3; puVar6 = puVar6 + 1)
      {
        *puVar6 = *puVar6 + 1;
      }
    }
  }
  if ((this->singletonType).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged == true) {
    local_80 = BrandTypeIterator::operator*((BrandTypeIterator *)this_00);
    __l._M_len = 1;
    __l._M_array = &local_80;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_48,__l,&local_22);
    local_58 = (this->singletonType).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_58;
    local_50.types = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_48;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_70,__l_00,&local_21
              );
    local_78.types = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_70;
    bVar4 = RecGroupShape::operator==(&local_50,&local_78);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base(&local_70);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base(&local_48);
    if (bVar4) {
      BrandTypeIterator::operator++((BrandTypeIterator *)this_00);
    }
  }
  TopologicalOrdersImpl<std::monostate>::~TopologicalOrdersImpl(&this->orders);
  TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl(&this->orders,&this->subtypeGraph);
  return;
}

Assistant:

void advanceBrand() {
    if (brand) {
      ++*brand;
    } else {
      brand.emplace();
      // Make room in the subtype graph for the brand type, which goes at the
      // beginning of the canonical order.
      subtypeGraph.insert(subtypeGraph.begin(), {{}});
      // Adjust indices.
      for (Index i = 1; i < subtypeGraph.size(); ++i) {
        for (auto& edge : subtypeGraph[i]) {
          ++edge;
        }
      }
    }
    // Make sure the brand is not the same as the real type.
    if (singletonType &&
        RecGroupShape({**brand}) == RecGroupShape({*singletonType})) {
      ++*brand;
    }
    // Start back at the initial permutation with the new brand.
    orders.~TopologicalOrders();
    new (&orders) TopologicalOrders(subtypeGraph);
  }